

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sign.c
# Opt level: O3

int main(int argc,char **argv)

{
  ulong uVar1;
  uint uVar2;
  uchar *sig;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int extraout_EAX;
  EVP_PKEY *pEVar10;
  EVP_PKEY_CTX *pEVar11;
  BIO_METHOD *type;
  BIO *bp;
  long lVar12;
  long lVar13;
  EC_KEY *key;
  EC_GROUP *group;
  uchar *puVar14;
  uchar *tbs;
  byte bVar15;
  uint uVar16;
  char *pcVar17;
  bool bVar18;
  test_sign *ptVar19;
  EVP_PKEY *pkey;
  EVP_PKEY *priv_key;
  EVP_PKEY *key2;
  uchar *kptr;
  uchar *tptr;
  EVP_PKEY *local_98;
  EVP_PKEY *local_90;
  byte local_81;
  byte local_80;
  byte local_7f;
  byte local_7e;
  byte local_7d;
  uint local_7c;
  EVP_PKEY *local_78;
  ulong local_70;
  size_t local_68;
  uint local_5c;
  char *local_58;
  uchar *local_50;
  test_sign *local_48;
  uchar *local_40;
  uchar *local_38;
  
  OPENSSL_init_crypto(0x4c,0);
  ptVar19 = test_signs;
  pcVar17 = "NID_id_GostR3410_2001_CryptoPro_A_ParamSet";
  uVar16 = 0;
  while( true ) {
    uVar1 = ptVar19->bits;
    printf("\x1b[1;34mTest %s:\x1b[m\n",pcVar17);
    if (uVar1 == 0x100) break;
    uVar7 = 0xffffffff;
    if (uVar1 == 0x200) {
      uVar7 = 0x3d4;
      local_58 = "gost2012_512";
      goto LAB_00102545;
    }
LAB_00102e5f:
    uVar16 = uVar16 | uVar7;
    pcVar17 = ptVar19[1].name;
    ptVar19 = ptVar19 + 1;
    if (pcVar17 == (char *)0x0) {
      pcVar17 = "\x1b[0;31m= Some tests FAILED!\x1b[m";
      if (uVar16 == 0) {
        pcVar17 = "\x1b[0;32m= All tests passed!\x1b[m";
      }
      puts(pcVar17);
      return uVar16;
    }
  }
  uVar7 = 0x3d3;
  local_58 = "gost2012_256";
LAB_00102545:
  local_70 = uVar1;
  pEVar10 = EVP_PKEY_new();
  local_98 = pEVar10;
  if (pEVar10 == (EVP_PKEY *)0x0) {
LAB_00102ee3:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("pkey = EVP_PKEY_new()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x83);
LAB_00102f0a:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_PKEY_CTX_new(pkey, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x86);
LAB_00102f31:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_keygen_init(ctx)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x87);
LAB_00102f58:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_CTX_ctrl(ctx, type, -1, EVP_PKEY_CTRL_GOST_PARAMSET, t->nid, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x88);
LAB_00102f7f:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("i2d_PrivateKey_bio(bp, priv_key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xb7);
LAB_00102fa6:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("key1 = EVP_PKEY_new()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe3);
LAB_00102fcd:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("sig = OPENSSL_malloc(siglen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x113);
LAB_00102ff4:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("i2d_PrivateKey_bio(bp, priv_key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xa1);
LAB_0010301b:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("BIO_reset(bp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xb6);
LAB_00103042:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("d2i_PrivateKey(type, &pkey, &tptr, klen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xd9);
LAB_00103069:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_CTX_ctrl_str(ctx1, \"paramset\", t->paramset)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe8);
LAB_00103090:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("sig2 = OPENSSL_malloc(siglen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x123);
LAB_001030b7:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("BIO_reset(bp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xa0);
LAB_001030de:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("d2i_PrivateKey_ex_bio(bp, &pkey, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xad);
LAB_00103105:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("klen = i2d_PrivateKey(priv_key, &kptr)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xd6);
LAB_0010312c:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_keygen_init(ctx1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe7);
LAB_00103153:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_sign_init(ctx)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x119);
LAB_0010317a:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("PEM_read_bio_PrivateKey(bp, &pkey, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x97);
LAB_001031a1:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("i2d_PrivateKey_bio(bp, priv_key)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xac);
LAB_001031c8:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("OSSL_STORE_eof(cts)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xc1);
LAB_001031ef:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx1 = EVP_PKEY_CTX_new(key1, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe6);
LAB_00103216:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_PKEY_CTX_new(priv_key, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x116);
LAB_0010323d:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("PEM_write_bio_PrivateKey(bp, priv_key, NULL, NULL, 0, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x95);
LAB_00103264:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("BIO_reset(bp)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xab);
LAB_0010328b:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("cts = OSSL_STORE_attach(bp, \"file\", NULL, NULL, NULL, NULL, NULL, NULL, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xbc);
LAB_001032b2:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_PKEY_set_type_str(key1, algname, strlen(algname))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xe4);
LAB_001032d9:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("hash = OPENSSL_zalloc(len)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x115);
LAB_00103300:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("bp = BIO_new(BIO_s_secmem())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0x94);
LAB_00103327:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("d2i_PrivateKey_bio(bp, &pkey)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                ,0xa2);
  }
  else {
    iVar3 = EVP_PKEY_set_type(pEVar10,uVar7);
    if (iVar3 == 0) {
      main_cold_2();
      uVar7 = 0xffffffff;
      goto LAB_00102e5f;
    }
    pEVar11 = EVP_PKEY_CTX_new(pEVar10,(ENGINE *)0x0);
    if (pEVar11 == (EVP_PKEY_CTX *)0x0) goto LAB_00102f0a;
    iVar3 = EVP_PKEY_keygen_init(pEVar11);
    if (iVar3 == 0) goto LAB_00102f31;
    local_7c = uVar7;
    local_5c = uVar16;
    iVar3 = EVP_PKEY_CTX_ctrl(pEVar11,uVar7,-1,0x1001,ptVar19->nid,(void *)0x0);
    if (iVar3 == 0) goto LAB_00102f58;
    local_90 = (EVP_PKEY *)0x0;
    iVar3 = EVP_PKEY_keygen(pEVar11,&local_90);
    printf("\tEVP_PKEY_keygen:\t");
    print_test_result(iVar3);
    EVP_PKEY_CTX_free(pEVar11);
    EVP_PKEY_free(local_98);
    uVar7 = 0xffffffff;
    uVar16 = local_5c;
    if (iVar3 != 1) goto LAB_00102e5f;
    type = (BIO_METHOD *)BIO_s_secmem();
    bp = BIO_new(type);
    if (bp == (BIO *)0x0) goto LAB_00103300;
    iVar3 = PEM_write_bio_PrivateKey
                      (bp,local_90,(EVP_CIPHER *)0x0,(uchar *)0x0,0,(undefined1 *)0x0,(void *)0x0);
    if (iVar3 == 0) goto LAB_0010323d;
    local_98 = (EVP_PKEY *)0x0;
    pEVar10 = PEM_read_bio_PrivateKey(bp,&local_98,(undefined1 *)0x0,(void *)0x0);
    if (pEVar10 == (EVP_PKEY *)0x0) goto LAB_0010317a;
    printf("\tPEM_read_bio_PrivateKey:");
    iVar3 = EVP_PKEY_cmp(local_90,local_98);
    print_test_result((uint)(iVar3 != 0));
    EVP_PKEY_free(local_98);
    lVar12 = BIO_ctrl(bp,1,0,(void *)0x0);
    if ((int)lVar12 == 0) goto LAB_001030b7;
    iVar4 = i2d_PrivateKey_bio(bp,local_90);
    if (iVar4 == 0) goto LAB_00102ff4;
    pEVar10 = d2i_PrivateKey_bio(bp,&local_98);
    if (pEVar10 == (EVP_PKEY *)0x0) goto LAB_00103327;
    printf("\td2i_PrivateKey_bio:\t");
    iVar4 = EVP_PKEY_cmp(local_90,local_98);
    print_test_result((uint)(iVar4 != 0));
    EVP_PKEY_free(local_98);
    lVar12 = BIO_ctrl(bp,1,0,(void *)0x0);
    if ((int)lVar12 == 0) goto LAB_00103264;
    iVar5 = i2d_PrivateKey_bio(bp,local_90);
    if (iVar5 == 0) goto LAB_001031a1;
    lVar12 = d2i_PrivateKey_ex_bio(bp,&local_98,0);
    if (lVar12 == 0) goto LAB_001030de;
    printf("\td2i_PrivateKey_ex_bio:\t");
    iVar5 = EVP_PKEY_cmp(local_90,local_98);
    print_test_result((uint)(iVar5 != 0));
    EVP_PKEY_free(local_98);
    lVar12 = BIO_ctrl(bp,1,0,(void *)0x0);
    if ((int)lVar12 == 0) goto LAB_0010301b;
    iVar6 = i2d_PrivateKey_bio(bp,local_90);
    if (iVar6 == 0) goto LAB_00102f7f;
    local_48 = ptVar19;
    printf("\tOSSL_STORE_attach:\t");
    fflush(_stdout);
    local_98 = (EVP_PKEY *)0x0;
    lVar12 = OSSL_STORE_attach(bp,"file",0,0,0,0,0,0,0);
    if (lVar12 == 0) goto LAB_0010328b;
    while (lVar13 = OSSL_STORE_load(lVar12), lVar13 != 0) {
      iVar6 = OSSL_STORE_INFO_get_type(lVar13);
      if ((iVar6 == 4) &&
         (local_98 = (EVP_PKEY *)OSSL_STORE_INFO_get1_PKEY(lVar13), local_98 == (EVP_PKEY *)0x0)) {
        ERR_print_errors_fp(_stderr);
        OPENSSL_die("(pkey = OSSL_STORE_INFO_get1_PKEY(info))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                    ,0xc5);
        goto LAB_00102ee3;
      }
      OSSL_STORE_INFO_free(lVar13);
    }
    ERR_print_errors_fp(_stderr);
    iVar6 = OSSL_STORE_eof(lVar12);
    if (iVar6 == 0) goto LAB_001031c8;
    bVar18 = (iVar3 == 0 || iVar4 == 0) || iVar5 == 0;
    OSSL_STORE_close(lVar12);
    ptVar19 = local_48;
    if (local_98 == (EVP_PKEY *)0x0) {
      puts("\x1b[1;36mskipped\x1b[m");
    }
    else {
      iVar3 = EVP_PKEY_cmp(local_90,local_98);
      print_test_result((uint)(iVar3 != 0));
      bVar18 = bVar18 || iVar3 == 0;
      EVP_PKEY_free(local_98);
    }
    BIO_free(bp);
    local_50 = (uchar *)0x0;
    iVar3 = i2d_PrivateKey(local_90,&local_50);
    if (iVar3 == 0) goto LAB_00103105;
    local_38 = local_50;
    local_98 = (EVP_PKEY *)0x0;
    pEVar10 = d2i_PrivateKey(local_7c,&local_98,&local_38,(long)iVar3);
    if (pEVar10 == (EVP_PKEY *)0x0) goto LAB_00103042;
    printf("\td2i_PrivateKey:\t\t");
    iVar3 = EVP_PKEY_cmp(local_90,local_98);
    print_test_result((uint)(iVar3 != 0));
    EVP_PKEY_free(local_98);
    CRYPTO_free(local_50);
    pEVar10 = EVP_PKEY_new();
    if (pEVar10 == (EVP_PKEY *)0x0) goto LAB_00102fa6;
    iVar4 = EVP_PKEY_set_type_str(pEVar10,local_58,0xc);
    if (iVar4 == 0) goto LAB_001032b2;
    pEVar11 = EVP_PKEY_CTX_new(pEVar10,(ENGINE *)0x0);
    if (pEVar11 == (EVP_PKEY_CTX *)0x0) goto LAB_001031ef;
    iVar4 = EVP_PKEY_keygen_init(pEVar11);
    if (iVar4 == 0) goto LAB_0010312c;
    local_58 = (char *)CONCAT71(local_58._1_7_,bVar18);
    local_7d = iVar3 == 0;
    iVar3 = EVP_PKEY_CTX_ctrl_str(pEVar11,"paramset",ptVar19->paramset);
    if (iVar3 == 0) goto LAB_00103069;
    local_78 = (EVP_PKEY *)0x0;
    iVar3 = EVP_PKEY_keygen(pEVar11,&local_78);
    printf("\tEVP_PKEY_*_str:\t\t");
    print_test_result(iVar3);
    uVar7 = EVP_PKEY_get_id(local_78);
    uVar16 = local_7c;
    printf("\tEVP_PKEY_id (%d):\t",(ulong)local_7c);
    local_7e = iVar3 == 0;
    if (uVar7 == uVar16) {
      printf("\x1b[1;32m%s\x1b[m\n","match");
    }
    else {
      printf("\x1b[1;31m%s [%d]\x1b[m\n","mismatch",(ulong)uVar7);
    }
    key = (EC_KEY *)EVP_PKEY_get0(local_78);
    group = EC_KEY_get0_group(key);
    uVar8 = EC_GROUP_get_curve_name(group);
    uVar16 = ptVar19->nid;
    printf("\tcurve_name (%d):\t",(ulong)uVar16);
    if (uVar8 == uVar16) {
      printf("\x1b[1;32m%s\x1b[m\n","match");
    }
    else {
      printf("\x1b[1;31m%s [%d]\x1b[m\n","mismatch",(ulong)uVar8);
    }
    bVar18 = uVar7 != local_7c;
    uVar7 = EVP_PKEY_cmp_parameters(local_90,local_78);
    printf("\tEVP_PKEY_cmp_parameters:");
    if (uVar7 == 1) {
      printf("\x1b[1;32m%s\x1b[m\n","success");
    }
    else {
      printf("\x1b[1;31m%s [%d]\x1b[m\n","failure",(ulong)uVar7);
    }
    uVar9 = EVP_PKEY_cmp(local_90,local_78);
    printf("\tEVP_PKEY_cmp:\t\t");
    uVar2 = (uint)(uVar9 == 0);
    if ((int)uVar9 < 0) {
      uVar2 = uVar9;
    }
    if (uVar9 == 0) {
      printf("\x1b[1;32m%s\x1b[m\n","differ (good)");
    }
    else {
      printf("\x1b[1;31m%s [%d]\x1b[m\n","equal (error)",(ulong)uVar2);
    }
    local_7c = CONCAT31(local_7c._1_3_,uVar2 != 1);
    EVP_PKEY_CTX_free(pEVar11);
    EVP_PKEY_free(pEVar10);
    iVar3 = EVP_PKEY_get_size(local_90);
    local_68 = (size_t)iVar3;
    puVar14 = (uchar *)CRYPTO_malloc(iVar3,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                                     ,0x113);
    if (puVar14 == (uchar *)0x0) goto LAB_00102fcd;
    local_70 = local_70 >> 3;
    local_80 = uVar7 != 1;
    local_7f = bVar18 || uVar8 != uVar16;
    tbs = (uchar *)CRYPTO_zalloc(local_70,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                                 ,0x115);
    if (tbs == (uchar *)0x0) goto LAB_001032d9;
    pEVar11 = EVP_PKEY_CTX_new(local_90,(ENGINE *)0x0);
    if (pEVar11 == (EVP_PKEY_CTX *)0x0) goto LAB_00103216;
    iVar3 = EVP_PKEY_sign_init(pEVar11);
    uVar1 = local_70;
    if (iVar3 == 0) goto LAB_00103153;
    local_40 = puVar14;
    iVar3 = EVP_PKEY_sign(pEVar11,puVar14,&local_68,tbs,local_70);
    printf("\tEVP_PKEY_sign:\t\t");
    print_test_result(iVar3);
    puVar14 = (uchar *)CRYPTO_malloc((int)local_68,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c"
                                     ,0x123);
    if (puVar14 == (uchar *)0x0) goto LAB_00103090;
    iVar4 = EVP_PKEY_sign(pEVar11,puVar14,&local_68,tbs,uVar1);
    if (iVar4 != 1) {
      main_cold_1();
      uVar7 = 0xffffffff;
      ptVar19 = local_48;
      uVar16 = local_5c;
      goto LAB_00102e5f;
    }
    local_81 = iVar3 != 1;
    printf("\tNon-determinism:\t");
    sig = local_40;
    iVar3 = bcmp(local_40,puVar14,local_68);
    print_test_result((uint)(iVar3 != 0));
    CRYPTO_free(puVar14);
    iVar4 = EVP_PKEY_verify_init(pEVar11);
    uVar1 = local_70;
    if (iVar4 == 0) goto LAB_00103375;
    *tbs = *tbs + '\x01';
    iVar4 = EVP_PKEY_verify(pEVar11,sig,local_68,tbs,local_70);
    printf("\tEVP_PKEY_verify:\t");
    print_test_result(iVar4);
    iVar5 = EVP_PKEY_verify_init(pEVar11);
    if (iVar5 != 0) {
      bVar15 = (byte)local_58 | local_7d | local_7e | local_7f | local_80 | (byte)local_7c |
               local_81;
      *tbs = *tbs + '\x01';
      uVar7 = EVP_PKEY_verify(pEVar11,sig,local_68,tbs,uVar1);
      uVar16 = (uint)(uVar7 == 0);
      if ((int)uVar7 < 0) {
        uVar16 = uVar7;
      }
      printf("\tFalse positive test:\t");
      print_test_result(uVar16);
      uVar7 = (uint)(byte)(uVar16 != 1 | (iVar4 != 1 || iVar3 == 0) | bVar15);
      EVP_PKEY_CTX_free(pEVar11);
      CRYPTO_free(sig);
      CRYPTO_free(tbs);
      EVP_PKEY_free(local_90);
      EVP_PKEY_free(local_78);
      ptVar19 = local_48;
      uVar16 = local_5c;
      goto LAB_00102e5f;
    }
  }
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_PKEY_verify_init(ctx)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c",
              0x134);
LAB_00103375:
  ERR_print_errors_fp(_stderr);
  iVar3 = 0x1047dd;
  OPENSSL_die("EVP_PKEY_verify_init(ctx)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_sign.c",
              300);
  if (iVar3 == 0) {
    iVar3 = puts("\x1b[1;31mfailure\x1b[m");
    return iVar3;
  }
  if (iVar3 != 1) {
    ERR_print_errors_fp(_stderr);
    return extraout_EAX;
  }
  iVar3 = puts("\x1b[1;32msuccess\x1b[m");
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
    int ret = 0;

    OPENSSL_add_all_algorithms_conf();

    struct test_sign *sp;
    for (sp = test_signs; sp->name; sp++)
	ret |= test_sign(sp);

    if (ret)
	printf(cDRED "= Some tests FAILED!" cNORM "\n");
    else
	printf(cDGREEN "= All tests passed!" cNORM "\n");
    return ret;
}